

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Root(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  DeadlyImportError *this_00;
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"X3D",&local_51);
  bVar1 = XML_SearchNode(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    ParseHelper_Group_Begin(this,false);
    while( true ) {
      iVar2 = (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
      if ((char)iVar2 == '\0') break;
      iVar2 = (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"head",&local_51);
        bVar1 = XML_CheckNode_NameEqual(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar1) {
          ParseNode_Head(this);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Scene",&local_51);
          bVar1 = XML_CheckNode_NameEqual(this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
            ParseNode_Scene(this);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Root",&local_51)
            ;
            XML_CheckNode_SkipUnsupported(this,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
    }
    if (this->NodeElement_Cur != (CX3DImporter_NodeElement *)0x0) {
      this->NodeElement_Cur = this->NodeElement_Cur->Parent;
    }
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Root node \"X3D\" not found.",&local_51);
  DeadlyImportError::DeadlyImportError(this_00,&local_50);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void X3DImporter::ParseNode_Root()
{
	// search for root tag <X3D>
    if ( !XML_SearchNode( "X3D" ) )
    {
        throw DeadlyImportError( "Root node \"X3D\" not found." );
    }

	ParseHelper_Group_Begin();// create root node element.
	// parse other contents
	while(mReader->read())
	{
        if ( mReader->getNodeType() != irr::io::EXN_ELEMENT )
        {
            continue;
        }

		if(XML_CheckNode_NameEqual("head"))
			ParseNode_Head();
		else if(XML_CheckNode_NameEqual("Scene"))
			ParseNode_Scene();
		else
			XML_CheckNode_SkipUnsupported("Root");
	}

	// exit from root node element.
	ParseHelper_Node_Exit();
}